

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eodata.cpp
# Opt level: O0

uint __thiscall EIF::GetKey(EIF *this,int keynum)

{
  size_type sVar1;
  EIF_Data *pEVar2;
  uint id;
  ulong local_28;
  size_t i;
  int keynum_local;
  EIF *this_local;
  
  local_28 = 0;
  while( true ) {
    sVar1 = std::vector<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>::size(&this->data)
    ;
    if (sVar1 <= local_28) {
      return 0;
    }
    id = (uint)local_28;
    pEVar2 = Get(this,id);
    if ((pEVar2->type == Key) && (pEVar2 = Get(this,id), (pEVar2->field_25).scrollmap == keynum))
    break;
    local_28 = local_28 + 1;
  }
  return id;
}

Assistant:

unsigned int EIF::GetKey(int keynum) const
{
	for (std::size_t i = 0; i < this->data.size(); ++i)
	{
		if (this->Get(i).type == EIF::Key && this->Get(i).key == keynum)
			return i;
	}

	return 0;
}